

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypesC.cpp
# Opt level: O2

void SoapySDRArgInfo_clear(SoapySDRArgInfo *info)

{
  free(info->key);
  info->key = (char *)0x0;
  free(info->value);
  info->value = (char *)0x0;
  free(info->name);
  info->name = (char *)0x0;
  free(info->description);
  info->description = (char *)0x0;
  free(info->units);
  info->units = (char *)0x0;
  SoapySDRStrings_clear(&info->options,info->numOptions);
  SoapySDRStrings_clear(&info->optionNames,info->numOptions);
  info->numOptions = 0;
  return;
}

Assistant:

void SoapySDRArgInfo_clear(SoapySDRArgInfo *info)
{
    //clear strings
    SoapySDR_free(info->key);
    info->key = NULL;

    SoapySDR_free(info->value);
    info->value = NULL;

    SoapySDR_free(info->name);
    info->name = NULL;

    SoapySDR_free(info->description);
    info->description = NULL;

    SoapySDR_free(info->units);
    info->units = NULL;

    //clear options
    SoapySDRStrings_clear(&info->options, info->numOptions);
    SoapySDRStrings_clear(&info->optionNames, info->numOptions);
    info->numOptions = 0;
}